

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O0

int __thiscall
CVmObjFrameDesc::getp_get_targprop
          (CVmObjFrameDesc *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  uint *in_RDI;
  CVmNativeCodeDesc *in_stack_ffffffffffffffb8;
  vm_val_t *in_stack_ffffffffffffffc8;
  CVmObjFrameRef *in_stack_ffffffffffffffd0;
  
  if ((getp_get_targprop(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_get_targprop(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_get_targprop::desc,0);
    __cxa_guard_release(&getp_get_targprop(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc(in_stack_ffffffffffffffc8,in_RDI,in_stack_ffffffffffffffb8)
  ;
  if (iVar1 == 0) {
    get_frame_ref((CVmObjFrameDesc *)0x2ff242);
    CVmObjFrameRef::get_targprop(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  }
  return 1;
}

Assistant:

int CVmObjFrameDesc::getp_get_targprop(VMG_ vm_obj_id_t self, vm_val_t *retval,
                                       uint *argc)
{
    /* check arguments */
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* get 'targetprop' from the frame */
    get_frame_ref(vmg0_)->get_targprop(vmg_ retval);

    /* handled */
    return TRUE;
}